

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenGlobalInitializer::InitializeCustomTargets(cmQtAutoGenGlobalInitializer *this)

{
  pointer puVar1;
  cmQtAutoGenGlobalInitializer *pcVar2;
  pointer puVar3;
  bool bVar4;
  pointer puVar5;
  cmQtAutoGenGlobalInitializer *pcVar6;
  cmQtAutoGenGlobalInitializer *pcVar7;
  unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_> *initializer;
  string comment;
  allocator<char> local_41;
  
  pcVar6 = (cmQtAutoGenGlobalInitializer *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar6,"Global AUTOGEN target",&local_41);
  pcVar7 = (cmQtAutoGenGlobalInitializer *)
           (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar7 != (cmQtAutoGenGlobalInitializer *)
                   &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header) {
    GetOrCreateGlobalTarget
              (pcVar6,*(cmLocalGenerator **)
                       &(pcVar7->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header
               ,(string *)
                &(pcVar7->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent,(string *)&stack0xffffffffffffffc0);
    pcVar2 = (cmQtAutoGenGlobalInitializer *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar7);
    pcVar6 = pcVar7;
    pcVar7 = pcVar2;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  pcVar6 = (cmQtAutoGenGlobalInitializer *)&stack0xffffffffffffffc0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pcVar6,"Global AUTORCC target",&local_41);
  pcVar7 = (cmQtAutoGenGlobalInitializer *)
           (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pcVar7 != (cmQtAutoGenGlobalInitializer *)
                   &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header) {
    GetOrCreateGlobalTarget
              (pcVar6,*(cmLocalGenerator **)
                       &(pcVar7->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header
               ,(string *)
                &(pcVar7->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent,(string *)&stack0xffffffffffffffc0);
    pcVar2 = (cmQtAutoGenGlobalInitializer *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar7);
    pcVar6 = pcVar7;
    pcVar7 = pcVar2;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  puVar1 = (this->Initializers_).
           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->Initializers_).
           super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar3;
    if (puVar5 == puVar1) break;
    bVar4 = cmQtAutoGenInitializer::InitCustomTargets
                      ((puVar5->_M_t).
                       super___uniq_ptr_impl<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmQtAutoGenInitializer_*,_std::default_delete<cmQtAutoGenInitializer>_>
                       .super__Head_base<0UL,_cmQtAutoGenInitializer_*,_false>._M_head_impl);
    puVar3 = puVar5 + 1;
  } while (bVar4);
  return puVar5 == puVar1;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::InitializeCustomTargets()
{
  // Initialize global autogen targets
  {
    std::string const comment = "Global AUTOGEN target";
    for (auto const& pair : this->GlobalAutoGenTargets_) {
      this->GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize global autorcc targets
  {
    std::string const comment = "Global AUTORCC target";
    for (auto const& pair : this->GlobalAutoRccTargets_) {
      this->GetOrCreateGlobalTarget(pair.first, pair.second, comment);
    }
  }
  // Initialize per target autogen targets
  for (auto& initializer : this->Initializers_) {
    if (!initializer->InitCustomTargets()) {
      return false;
    }
  }
  return true;
}